

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

void nghttp2_hd_inflate_free(nghttp2_hd_inflater *inflater)

{
  nghttp2_rcbuf_decref(inflater->nv_value_keep);
  nghttp2_rcbuf_decref(inflater->nv_name_keep);
  inflater->nv_name_keep = (nghttp2_rcbuf *)0x0;
  inflater->nv_value_keep = (nghttp2_rcbuf *)0x0;
  nghttp2_rcbuf_decref(inflater->valuercbuf);
  nghttp2_rcbuf_decref(inflater->namercbuf);
  hd_context_free(&inflater->ctx);
  return;
}

Assistant:

void nghttp2_hd_inflate_free(nghttp2_hd_inflater *inflater) {
  hd_inflate_keep_free(inflater);

  nghttp2_rcbuf_decref(inflater->valuercbuf);
  nghttp2_rcbuf_decref(inflater->namercbuf);

  hd_context_free(&inflater->ctx);
}